

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void single_channel_8_to_xrgb_8888
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  int *piVar1;
  int *piVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  
  if (0 < height) {
    pbVar3 = (byte *)((long)src + (long)(sy * src_pitch) + (long)sx);
    iVar4 = dst_pitch + 3;
    if (-1 < dst_pitch) {
      iVar4 = dst_pitch;
    }
    piVar2 = (int *)((long)dst + (long)dx * 4 + (long)(dy * dst_pitch));
    iVar5 = 0;
    do {
      if (0 < width) {
        piVar1 = piVar2 + width;
        do {
          *piVar2 = (uint)*pbVar3 << 0x10;
          piVar2 = piVar2 + 1;
          pbVar3 = pbVar3 + 1;
        } while (piVar2 < piVar1);
      }
      pbVar3 = pbVar3 + (src_pitch - width);
      piVar2 = piVar2 + ((iVar4 >> 2) - width);
      iVar5 = iVar5 + 1;
    } while (iVar5 != height);
  }
  return;
}

Assistant:

static void single_channel_8_to_xrgb_8888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint8_t *src_ptr = (const uint8_t *)((const char *)src + sy * src_pitch);
   uint32_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 1 - width;
   int dst_gap = dst_pitch / 4 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint32_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_SINGLE_CHANNEL_8_TO_XRGB_8888(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}